

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

bool __thiscall
google::protobuf::Reflection::IsInlinedStringDonated
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  uint32_t has_bit_index;
  uint32_t uVar2;
  Nonnull<const_char_*> pcVar3;
  
  has_bit_index = internal::ReflectionSchema::InlinedStringIndex(&this->schema_,field);
  if (has_bit_index == 0) {
    pcVar3 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>(0,0,"index > 0u");
  }
  else {
    pcVar3 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar3 == (Nonnull<const_char_*>)0x0) {
    if ((this->schema_).inlined_string_donated_offset_ != -1) {
      uVar2 = internal::ReflectionSchema::InlinedStringDonatedOffset(&this->schema_);
      bVar1 = anon_unknown_6::IsIndexInHasBitSet
                        ((uint32_t *)
                         ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),
                         has_bit_index);
      return bVar1;
    }
    IsInlinedStringDonated();
  }
  IsInlinedStringDonated();
}

Assistant:

bool Reflection::IsInlinedStringDonated(const Message& message,
                                        const FieldDescriptor* field) const {
  uint32_t index = schema_.InlinedStringIndex(field);
  ABSL_DCHECK_GT(index, 0u);
  return IsIndexInHasBitSet(GetInlinedStringDonatedArray(message), index);
}